

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgreen-runner.c
# Opt level: O0

char * get_a_suite_name(char *suite_option,char *test_library_name)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 in_RSI;
  long in_RDI;
  char *s;
  char *suite_name;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    pcVar1 = (char *)string_dup(in_RSI);
    pcVar2 = __xpg_basename(pcVar1);
    local_8 = (char *)string_dup(pcVar2);
    free(pcVar1);
    pcVar1 = strchr(local_8,0x2e);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
  }
  else {
    local_8 = (char *)string_dup(in_RDI);
  }
  return local_8;
}

Assistant:

static char* get_a_suite_name(const char *suite_option, const char *test_library_name) {
    if (suite_option == NULL) {
        char *suite_name;
        char *s;
        /* basename can return the parameter or an internal static string. Work around this. */
        s = string_dup(test_library_name);
        suite_name = string_dup(basename(s));
        free(s);
        if ((s = strchr(suite_name, '.'))) {
            *s = '\0';
        }
        return suite_name;
    } else {
        return string_dup(suite_option);
    }
}